

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_InitCachedFuncs(InterpreterStackFrame *this,OpLayoutAuxNoReg *playout)

{
  uint offset;
  Var varScope;
  FunctionBody *functionBody;
  AuxArray<Js::FuncInfoEntry> *info_00;
  FrameDisplay *pDisplay;
  ScriptContext *scriptContext;
  FuncInfoArray *info;
  OpLayoutAuxNoReg *playout_local;
  InterpreterStackFrame *this_local;
  
  offset = playout->Offset;
  functionBody = GetFunctionBody(this);
  info_00 = ByteCodeReader::ReadAuxArray<Js::FuncInfoEntry>(offset,functionBody);
  varScope = *(Var *)(this + 0x58);
  pDisplay = GetLocalFrameDisplay(this);
  scriptContext = GetScriptContext(this);
  Js::JavascriptOperators::OP_InitCachedFuncs(varScope,pDisplay,info_00,scriptContext);
  return;
}

Assistant:

void InterpreterStackFrame::OP_InitCachedFuncs(const unaligned OpLayoutAuxNoReg * playout)
    {
        const FuncInfoArray *info = Js::ByteCodeReader::ReadAuxArray<FuncInfoEntry>(playout->Offset, this->GetFunctionBody());
        JavascriptOperators::OP_InitCachedFuncs(this->localClosure, GetLocalFrameDisplay(), info, GetScriptContext());
    }